

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O2

bool __thiscall
S2MinDistanceShapeIndexTarget::UpdateMinDistance
          (S2MinDistanceShapeIndexTarget *this,S2MinDistanceTarget *target,S2MinDistance *min_dist)

{
  Result RVar1;
  
  *(double *)
   &(((this->query_)._M_t.
      super___uniq_ptr_impl<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>_>._M_t.
      super__Tuple_impl<0UL,_S2ClosestEdgeQuery_*,_std::default_delete<S2ClosestEdgeQuery>_>.
      super__Head_base<0UL,_S2ClosestEdgeQuery_*,_false>._M_head_impl)->options_).super_Options =
       (min_dist->super_S1ChordAngle).length2_;
  RVar1 = S2ClosestEdgeQuery::FindClosestEdge
                    ((this->query_)._M_t.
                     super___uniq_ptr_impl<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_S2ClosestEdgeQuery_*,_std::default_delete<S2ClosestEdgeQuery>_>
                     .super__Head_base<0UL,_S2ClosestEdgeQuery_*,_false>._M_head_impl,target);
  if (-1 < RVar1.shape_id_) {
    (min_dist->super_S1ChordAngle).length2_ = (double)RVar1.distance_.super_S1ChordAngle.length2_;
  }
  return -1 < RVar1.shape_id_;
}

Assistant:

inline bool S2MinDistanceShapeIndexTarget::UpdateMinDistance(
    S2MinDistanceTarget* target, S2MinDistance* min_dist) {
  query_->mutable_options()->set_max_distance(*min_dist);
  S2ClosestEdgeQuery::Result r = query_->FindClosestEdge(target);
  if (r.is_empty()) return false;
  *min_dist = r.distance();
  return true;
}